

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_member_reference_abi_cxx11_
          (CompilerMSL *this,uint32_t base,SPIRType *type,uint32_t index,bool ptr_chain_is_resolved)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  undefined3 in_register_00000081;
  byte in_R9B;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  undefined1 local_98 [48];
  undefined1 local_68 [36];
  uint32_t local_44;
  ID IStack_40;
  bool is_buffer_variable;
  bool local_3a;
  bool local_39;
  bool is_block;
  SPIRVariable *pSStack_38;
  bool declared_as_pointer;
  SPIRVariable *var;
  bool ptr_chain_is_resolved_local;
  long lStack_28;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *pCStack_18;
  uint32_t base_local;
  CompilerMSL *this_local;
  
  var._4_4_ = CONCAT31(in_register_00000081,ptr_chain_is_resolved);
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,base);
  lStack_28 = CONCAT44(in_register_0000000c,index);
  type_local._4_4_ = (uint32_t)type;
  var._3_1_ = in_R9B & 1;
  pCStack_18 = this_00;
  this_local = this;
  pSStack_38 = Compiler::maybe_get_backing_variable((Compiler *)this_00,type_local._4_4_);
  local_39 = false;
  if (pSStack_38 != (SPIRVariable *)0x0) {
    IStack_40.id = *(uint32_t *)(lStack_28 + 8);
    bVar1 = Compiler::has_decoration((Compiler *)this_00,IStack_40,DecorationBlock);
    local_b1 = true;
    if (!bVar1) {
      local_44 = *(uint32_t *)(lStack_28 + 8);
      local_b1 = Compiler::has_decoration((Compiler *)this_00,(ID)local_44,DecorationBufferBlock);
    }
    local_3a = local_b1;
    local_b2 = false;
    if (local_b1 != false) {
      local_b3 = true;
      if (pSStack_38->storage != StorageClassUniform) {
        local_b3 = pSStack_38->storage == StorageClassStorageBuffer;
      }
      local_b2 = local_b3;
    }
    local_68[0x23] = local_b2;
    local_b4 = false;
    if (local_b2 != false) {
      id = TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(pSStack_38->super_IVariant).field_0xc);
      type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,id);
      local_b4 = Compiler::is_array((Compiler *)this_00,type_00);
    }
    local_39 = local_b4;
  }
  if ((local_39 != false) ||
     (((var._3_1_ & 1) == 0 &&
      (bVar1 = CompilerGLSL::should_dereference(this_00,type_local._4_4_), bVar1)))) {
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_68,(SPIRType *)this_00,(uint32_t)lStack_28);
    join<char_const(&)[3],std::__cxx11::string>
              ((spirv_cross *)this,(char (*) [3])0x5f0ee8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    ::std::__cxx11::string::~string((string *)local_68);
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_98,(SPIRType *)this_00,(uint32_t)lStack_28);
    join<char_const(&)[2],std::__cxx11::string>
              ((spirv_cross *)this,(char (*) [2])0x5ea727,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    ::std::__cxx11::string::~string((string *)local_98);
  }
  return this;
}

Assistant:

string CompilerMSL::to_member_reference(uint32_t base, const SPIRType &type, uint32_t index, bool ptr_chain_is_resolved)
{
	auto *var = maybe_get_backing_variable(base);
	// If this is a buffer array, we have to dereference the buffer pointers.
	// Otherwise, if this is a pointer expression, dereference it.

	bool declared_as_pointer = false;

	if (var)
	{
		// Only allow -> dereference for block types. This is so we get expressions like
		// buffer[i]->first_member.second_member, rather than buffer[i]->first->second.
		bool is_block = has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

		bool is_buffer_variable =
		    is_block && (var->storage == StorageClassUniform || var->storage == StorageClassStorageBuffer);
		declared_as_pointer = is_buffer_variable && is_array(get<SPIRType>(var->basetype));
	}

	if (declared_as_pointer || (!ptr_chain_is_resolved && should_dereference(base)))
		return join("->", to_member_name(type, index));
	else
		return join(".", to_member_name(type, index));
}